

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddExtension(Tables *this,FieldDescriptor *field)

{
  bool bVar1;
  int local_3c;
  Descriptor *local_38;
  undefined1 local_30 [8];
  DescriptorIntPair key;
  FieldDescriptor *field_local;
  Tables *this_local;
  
  key._8_8_ = field;
  local_38 = FieldDescriptor::containing_type(field);
  local_3c = FieldDescriptor::number((FieldDescriptor *)key._8_8_);
  std::pair<const_google::protobuf::Descriptor_*,_int>::
  pair<const_google::protobuf::Descriptor_*,_int,_true>
            ((pair<const_google::protobuf::Descriptor_*,_int> *)local_30,&local_38,&local_3c);
  bVar1 = InsertIfNotPresent<std::map<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,std::less<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>>>
                    (&this->extensions_,(first_type *)local_30,(second_type *)&key.second);
  if (bVar1) {
    std::
    vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
    ::push_back(&this->extensions_after_checkpoint_,(value_type *)local_30);
  }
  return bVar1;
}

Assistant:

bool DescriptorPool::Tables::AddExtension(const FieldDescriptor* field) {
  DescriptorIntPair key(field->containing_type(), field->number());
  if (InsertIfNotPresent(&extensions_, key, field)) {
    extensions_after_checkpoint_.push_back(key);
    return true;
  } else {
    return false;
  }
}